

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fCopyImageTests.cpp
# Opt level: O1

vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_> *
deqp::gles31::Functional::anon_unknown_0::getLevelAccesses
          (vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
           *__return_storage_ptr__,
          vector<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
          *data,ImageInfo *info)

{
  pointer pAVar1;
  long lVar2;
  int iVar3;
  long lVar4;
  IVec3 levelSize;
  IVec3 size;
  TextureFormat format;
  int local_80 [4];
  undefined8 local_70;
  int local_68;
  TextureFormat local_60;
  ConstPixelBufferAccess local_58;
  
  local_60 = glu::mapGLInternalFormat(info->m_format);
  local_80[3] = (info->m_size).m_data[2];
  local_68 = local_80[3];
  local_70 = *(undefined8 *)(info->m_size).m_data;
  (__return_storage_ptr__->
  super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pAVar1 = (data->
           super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(data->
                              super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
                              )._M_impl.super__Vector_impl_data._M_finish - (long)pAVar1) >> 4)) {
    lVar4 = 0;
    do {
      local_80[2] = 0;
      local_80[0] = 0;
      local_80[1] = 0;
      lVar2 = 0;
      if (info->m_target == 0x8c1a) {
        do {
          iVar3 = *(int *)((long)&local_70 + lVar2 * 4) >> ((byte)lVar4 & 0x1f);
          if (iVar3 < 2) {
            iVar3 = 1;
          }
          local_80[lVar2] = iVar3;
          lVar2 = lVar2 + 1;
        } while (lVar2 == 1);
        local_80[2] = local_80[3];
      }
      else {
        do {
          iVar3 = *(int *)((long)&local_70 + lVar2 * 4) >> ((byte)lVar4 & 0x1f);
          if (iVar3 < 2) {
            iVar3 = 1;
          }
          local_80[lVar2] = iVar3;
          lVar2 = lVar2 + 1;
        } while (lVar2 != 3);
      }
      tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
                (&local_58,&local_60,local_80[0],local_80[1],local_80[2],pAVar1[lVar4].m_ptr);
      std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>::
      emplace_back<tcu::ConstPixelBufferAccess>(__return_storage_ptr__,&local_58);
      lVar4 = lVar4 + 1;
      pAVar1 = (data->
               super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
    } while (lVar4 < (int)((ulong)((long)(data->
                                         super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
                                         )._M_impl.super__Vector_impl_data._M_finish - (long)pAVar1)
                          >> 4));
  }
  return __return_storage_ptr__;
}

Assistant:

vector<tcu::ConstPixelBufferAccess> getLevelAccesses (const vector<ArrayBuffer<deUint8> >& data, const ImageInfo& info)
{
	const tcu::TextureFormat			format	= glu::mapGLInternalFormat(info.getFormat());
	const IVec3							size	= info.getSize();

	vector<tcu::ConstPixelBufferAccess>	result;

	DE_ASSERT((int)data.size() == getLevelCount(info));

	for (int level = 0; level < (int)data.size(); level++)
	{
		const IVec3 levelSize = getLevelSize(info.getTarget(), size, level);

		result.push_back(tcu::ConstPixelBufferAccess(format, levelSize.x(), levelSize.y(), levelSize.z(), data[level].getPtr()));
	}

	return result;
}